

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qabstractitemdelegate.cpp
# Opt level: O1

void QAbstractItemDelegate::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  long *plVar1;
  offset_in_QAbstractItemDelegate_to_subr *candidate;
  undefined8 *puVar2;
  undefined4 uVar3;
  int iVar4;
  long in_FS_OFFSET;
  undefined4 local_44;
  undefined8 local_40;
  void *local_38;
  undefined8 *puStack_30;
  undefined4 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (_c == RegisterMethodArgumentMetaType) {
    switch(_id) {
    case 0:
    case 1:
    case 2:
    case 4:
      puVar2 = (undefined8 *)*_a;
      if (*_a[1] == 0) {
        *puVar2 = &QtPrivate::QMetaTypeInterfaceWrapper<QWidget_*>::metaType;
        goto LAB_0053833e;
      }
      break;
    default:
      puVar2 = (undefined8 *)*_a;
    }
    *puVar2 = 0;
    goto LAB_0053833e;
  }
  if (_c == IndexOfMethod) {
    plVar1 = (long *)_a[1];
    if (((((code *)*plVar1 == commitData) && (uVar3 = 0, plVar1[1] == 0)) ||
        (((code *)*plVar1 == closeEditor && (uVar3 = 1, plVar1[1] == 0)))) ||
       (((code *)*plVar1 == sizeHintChanged && (uVar3 = 3, plVar1[1] == 0)))) {
      *(undefined4 *)*_a = uVar3;
    }
    goto LAB_0053833e;
  }
  if (_c != InvokeMetaMethod) goto LAB_0053833e;
  switch(_id) {
  case 0:
    local_40 = *_a[1];
    puStack_30 = &local_40;
    iVar4 = 0;
    break;
  case 1:
    local_40 = *_a[1];
    local_44 = *_a[2];
    goto LAB_00538272;
  case 2:
    local_40 = *_a[1];
    local_44 = 0;
LAB_00538272:
    puStack_30 = &local_40;
    local_28 = &local_44;
    iVar4 = 1;
    break;
  case 3:
    puStack_30 = (undefined8 *)_a[1];
    iVar4 = 3;
    break;
  case 4:
    QAbstractItemDelegatePrivate::_q_commitDataAndCloseEditor
              (*(QAbstractItemDelegatePrivate **)(_o + 8),*_a[1]);
  default:
    goto LAB_0053833e;
  }
  local_38 = (void *)0x0;
  QMetaObject::activate(_o,&staticMetaObject,iVar4,&local_38);
LAB_0053833e:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QAbstractItemDelegate::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QAbstractItemDelegate *>(_o);
    if (_c == QMetaObject::InvokeMetaMethod) {
        switch (_id) {
        case 0: _t->commitData((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 1: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1])),(*reinterpret_cast< std::add_pointer_t<QAbstractItemDelegate::EndEditHint>>(_a[2]))); break;
        case 2: _t->closeEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        case 3: _t->sizeHintChanged((*reinterpret_cast< std::add_pointer_t<QModelIndex>>(_a[1]))); break;
        case 4: _t->d_func()->_q_commitDataAndCloseEditor((*reinterpret_cast< std::add_pointer_t<QWidget*>>(_a[1]))); break;
        default: ;
        }
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        switch (_id) {
        default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
        case 0:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 1:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 2:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        case 4:
            switch (*reinterpret_cast<int*>(_a[1])) {
            default: *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType(); break;
            case 0:
                *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType::fromType< QWidget* >(); break;
            }
            break;
        }
    }
    if (_c == QMetaObject::IndexOfMethod) {
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * )>(_a, &QAbstractItemDelegate::commitData, 0))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(QWidget * , QAbstractItemDelegate::EndEditHint )>(_a, &QAbstractItemDelegate::closeEditor, 1))
            return;
        if (QtMocHelpers::indexOfMethod<void (QAbstractItemDelegate::*)(const QModelIndex & )>(_a, &QAbstractItemDelegate::sizeHintChanged, 3))
            return;
    }
}